

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bond.hpp
# Opt level: O2

void __thiscall OpenMD::Bond::~Bond(Bond *this)

{
  ~Bond(this);
  operator_delete(this,0x98);
  return;
}

Assistant:

void calcForce(bool doParticlePot) {
      RealType len;
      RealType dvdr;
      Vector3d r12;
      Vector3d force;

      r12 = atoms_[1]->getPos() - atoms_[0]->getPos();
      snapshotMan_->getCurrentSnapshot()->wrapVector(r12);
      len = r12.length();
      bondType_->calcForce(len, potential_, dvdr);

      force = r12 * (-dvdr / len);

      atoms_[0]->addFrc(-force);
      atoms_[1]->addFrc(force);
      if (doParticlePot) {
        atoms_[0]->addParticlePot(potential_);
        atoms_[1]->addParticlePot(potential_);
      }
    }